

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
DoSetProperty<Js::OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)0>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout,Var instance,
          PropertyOperationFlags flags)

{
  bool bVar1;
  PropertyId pid;
  InlineCache *in_RAX;
  RecyclableObject *instance_00;
  ConstructorCache *pCVar2;
  InlineCache *local_38;
  InlineCache *inlineCache;
  
  local_38 = in_RAX;
  pid = GetPropertyIdFromCacheId(this,(uint)playout->inlineCacheIndex);
  bVar1 = TaggedNumber::Is(instance);
  if (!bVar1) {
    instance_00 = UnsafeVarTo<Js::RecyclableObject>(instance);
    bVar1 = TrySetPropertyLocalFastPath<Js::OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)0>>const__unaligned>
                      (this,playout,pid,instance_00,&local_38,flags);
    if (bVar1) {
      pCVar2 = JavascriptFunction::GetConstructorCache(*(JavascriptFunction **)(this + 0x80));
      if ((pCVar2->content).updateAfterCtor != true) {
        return;
      }
      InlineCache::RemoveFromInvalidationListAndClear
                (local_38,*(ThreadContext **)(*(long *)(this + 0x78) + 0x3b8));
      return;
    }
  }
  DoSetProperty_NoFastPath<Js::OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)0>>const__unaligned>
            (this,playout,instance,flags);
  return;
}

Assistant:

inline void InterpreterStackFrame::DoSetProperty(unaligned T* playout, Var instance, PropertyOperationFlags flags)
    {
        // Same fast path as in the backend.

        PropertyId propertyId = GetPropertyIdFromCacheId(playout->inlineCacheIndex);
        InlineCache *inlineCache;

        if (!TaggedNumber::Is(instance)
            && TrySetPropertyLocalFastPath(playout, propertyId, UnsafeVarTo<RecyclableObject>(instance), inlineCache, flags))
        {
            if (GetJavascriptFunction()->GetConstructorCache()->NeedsUpdateAfterCtor())
            {
                // This function has only 'this' statements and is being used as a constructor. When the constructor exits, the
                // function object's constructor cache will be updated with the type produced by the constructor. From that
                // point on, when the same function object is used as a constructor, the a new object with the final type will
                // be created. Whatever is stored in the inline cache currently will cause cache misses after the constructor
                // cache update. So, just clear it now so that the caches won't be flagged as polymorphic.
                inlineCache->RemoveFromInvalidationListAndClear(this->GetScriptContext()->GetThreadContext());
            }
            return;
        }

        DoSetProperty_NoFastPath(playout, instance, flags);
    }